

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void gai_mem_copy(int elemsize,int ndim,void *src_ptr,Integer *src_start,Integer *count,
                 Integer *src_ld,void *dst_ptr,Integer *dst_start,Integer *dst_ld)

{
  Integer IVar1;
  Integer IVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int dst_bunit [7];
  int aiStack_d8 [8];
  int src_bunit [7];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar10 = ndim - 1;
  uVar15 = 0;
  uVar14 = 0;
  if (0 < ndim) {
    uVar14 = (ulong)(uint)ndim;
  }
  lVar4 = 0;
  lVar5 = 1;
  for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
    lVar13 = lVar5;
    if ((long)uVar15 < (long)(int)uVar10) {
      lVar13 = src_ld[uVar15] * lVar5;
    }
    lVar4 = lVar4 + lVar5 * src_start[uVar15];
    lVar5 = lVar13;
  }
  lVar13 = 0;
  lVar5 = 1;
  for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
    lVar7 = lVar5;
    if ((long)uVar15 < (long)(int)uVar10) {
      lVar7 = dst_ld[uVar15] * lVar5;
    }
    lVar13 = lVar13 + lVar5 * dst_start[uVar15];
    lVar5 = lVar7;
  }
  uVar15 = 0;
  uVar14 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar14 = uVar15;
  }
  IVar1 = *count;
  iVar12 = elemsize;
  iVar6 = elemsize;
  for (; uVar14 * 4 != uVar15; uVar15 = uVar15 + 4) {
    iVar6 = iVar6 * *(int *)((long)src_ld + uVar15 * 2);
    *(int *)((long)aiStack_58 + uVar15 + 4) = iVar6;
    iVar12 = iVar12 * *(int *)((long)dst_ld + uVar15 * 2);
    *(int *)((long)aiStack_78 + uVar15 + 4) = iVar12;
  }
  lVar7 = (long)ndim;
  iVar12 = 1;
  for (lVar5 = 1; lVar5 < lVar7; lVar5 = lVar5 + 1) {
    iVar12 = iVar12 * (int)count[lVar5];
  }
  aiStack_98[1] = 0;
  aiStack_d8[1] = 0;
  src_bunit[0] = 1;
  src_bunit[1] = 1;
  dst_bunit[0] = 1;
  dst_bunit[1] = 1;
  for (lVar5 = 2; lVar5 < lVar7; lVar5 = lVar5 + 1) {
    aiStack_98[lVar5] = 0;
    aiStack_d8[lVar5] = 0;
    IVar2 = count[lVar5 + -1];
    src_bunit[lVar5] = src_bunit[lVar5 + -1] * (int)IVar2;
    dst_bunit[lVar5] = (int)IVar2 * dst_bunit[lVar5 + -1];
  }
  iVar6 = 0;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  while (iVar6 != iVar12) {
    iVar6 = iVar6 + 1;
    lVar8 = 0;
    for (lVar5 = 1; lVar5 < lVar7; lVar5 = lVar5 + 1) {
      lVar8 = lVar8 + (long)aiStack_58[lVar5] * (long)aiStack_98[lVar5];
      lVar9 = (long)aiStack_98[lVar5] + (ulong)(iVar6 % src_bunit[lVar5] == 0);
      iVar3 = 0;
      if (lVar9 < count[lVar5]) {
        iVar3 = (int)lVar9;
      }
      aiStack_98[lVar5] = iVar3;
    }
    lVar9 = 0;
    for (lVar5 = 1; lVar5 < lVar7; lVar5 = lVar5 + 1) {
      lVar9 = lVar9 + (long)aiStack_78[lVar5] * (long)aiStack_d8[lVar5];
      lVar11 = (long)aiStack_d8[lVar5] + (ulong)(iVar6 % dst_bunit[lVar5] == 0);
      iVar3 = 0;
      if (lVar11 < count[lVar5]) {
        iVar3 = (int)lVar11;
      }
      aiStack_d8[lVar5] = iVar3;
    }
    memcpy((void *)((long)dst_ptr + lVar9 + lVar13 * elemsize),
           (void *)((long)src_ptr + lVar8 + lVar4 * elemsize),(long)((int)IVar1 * elemsize));
  }
  return;
}

Assistant:

void gai_mem_copy(int elemsize, int ndim, void *src_ptr, Integer *src_start,
    Integer *count,  Integer *src_ld, void *dst_ptr, Integer *dst_start,
    Integer *dst_ld)
{
  Integer src_offset, dst_offset;
  Integer factor;
  void *sptr, *dptr;
  int i, j;
  long src_idx, dst_idx;
  int n1dim; /* total number of contiguous segments */
  int src_bvalue[MAXDIM], src_bunit[MAXDIM];
  int dst_bvalue[MAXDIM], dst_bunit[MAXDIM];
  int src_stride[MAXDIM], dst_stride[MAXDIM];
  int segsize;
  /* find offsets for both source and destination buffers and use these to
   * adjust pointers to the first element in each data set
   */
  factor = 1;
  src_offset = 0;
  for (i=0; i<ndim; i++) {
    src_offset += src_start[i]*factor;
    if (i<ndim-1) factor *= src_ld[i];
  }
  sptr = (void*)((char*)src_ptr+src_offset*elemsize);

  factor = 1; //reset the factor

  dst_offset = 0;
  for (i=0; i<ndim; i++) {
    dst_offset += dst_start[i]*factor;
    if (i<ndim-1) factor *= dst_ld[i];
  }
  dptr = (void*)((char*)dst_ptr+dst_offset*elemsize);
  segsize = count[0]*elemsize;
  /* perform the memcpy from source to destination buffer. Start by calculating
   * the total number of contiguous segments in the src array*/
  n1dim = 1;

  src_stride[0] = dst_stride[0] = elemsize;
  for (i=0; i<ndim-1; i++) {
    src_stride[i+1] = src_stride[i];
    src_stride[i+1] *= (int)src_ld[i];
    dst_stride[i+1] = dst_stride[i];
    dst_stride[i+1] *= (int)dst_ld[i];
  }

  for (i=1; i<=ndim-1; i++) {
    n1dim *= count[i];
  }
  /* initialize arrays for evaluating offset of each segment */
  src_bvalue[0] = 0;
  src_bvalue[1] = 0;
  src_bunit[0] = 1;
  src_bunit[1] = 1;
  dst_bvalue[0] = 0;
  dst_bvalue[1] = 0;
  dst_bunit[0] = 1;
  dst_bunit[1] = 1;

  //this part does nothing?
  for (i=2; i<=ndim-1; i++) {
    src_bvalue[i] = 0;
    dst_bvalue[i] = 0;
    src_bunit[i] = src_bunit[i-1]*count[i-1];
    dst_bunit[i] = dst_bunit[i-1]*count[i-1];
  }

  /* evaluate offset for each contiguous segment */
  for (i=0; i<n1dim; i++) {
    src_idx = 0;
    dst_idx = 0;
    for (j=1; j<=ndim-1; j++) {
      src_idx += src_bvalue[j]*src_stride[j];
      if ((i+1)%src_bunit[j] == 0) {
        src_bvalue[j]++;
      }
      if (src_bvalue[j] > (count[j]-1)) {
        src_bvalue[j] = 0;
      }
    }
    for (j=1; j<=ndim-1; j++) {
      dst_idx += dst_bvalue[j]*dst_stride[j];
      if ((i+1)%dst_bunit[j] == 0) {
        dst_bvalue[j]++;
      }
      if (dst_bvalue[j] > (count[j]-1)) {
        dst_bvalue[j] = 0;
      }
    }
    /* copy memory */
    memcpy((char*)dptr+dst_idx,(char*)sptr+src_idx,segsize);
  }
}